

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  Geometry *pGVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined1 (*pauVar15) [16];
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  RTCRayQueryContext *pRVar20;
  ulong uVar21;
  long lVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  ulong uVar25;
  Scene *pSVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined8 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar92;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar90;
  float fVar91;
  undefined1 auVar89 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  float fVar95;
  float fVar97;
  float fVar98;
  undefined1 auVar96 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar110;
  float fVar111;
  undefined1 auVar109 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2791;
  ulong local_2790;
  RayHit *local_2788;
  undefined1 local_2780 [16];
  undefined8 local_2770;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  long local_2740;
  int local_2734;
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  RayQueryContext *local_26f8;
  undefined1 local_26f0 [16];
  RTCFilterFunctionNArguments local_26e0;
  undefined1 local_26b0 [16];
  long local_26a0;
  ulong local_2698;
  undefined4 local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  undefined4 local_2684;
  undefined4 local_2680;
  undefined4 local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined1 local_2650 [16];
  undefined1 local_2640 [32];
  undefined1 local_2620 [16];
  undefined1 *local_2610;
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [2] [16];
  undefined1 local_2580 [32];
  undefined4 local_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar15 = (undefined1 (*) [16])local_2390;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar47 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar82 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    local_2650._8_4_ = 0x7fffffff;
    local_2650._0_8_ = 0x7fffffff7fffffff;
    local_2650._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx((undefined1  [16])aVar1,local_2650);
    auVar81._8_4_ = 0x219392ef;
    auVar81._0_8_ = 0x219392ef219392ef;
    auVar81._12_4_ = 0x219392ef;
    auVar40 = vcmpps_avx(auVar40,auVar81,1);
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = 0x3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    auVar81 = vdivps_avx(auVar69,(undefined1  [16])aVar1);
    auVar70._8_4_ = 0x5d5e0b6b;
    auVar70._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar70._12_4_ = 0x5d5e0b6b;
    auVar40 = vblendvps_avx(auVar81,auVar70,auVar40);
    uStack_2398 = 0;
    auVar61._0_4_ = auVar40._0_4_ * 0.99999964;
    auVar61._4_4_ = auVar40._4_4_ * 0.99999964;
    auVar61._8_4_ = auVar40._8_4_ * 0.99999964;
    auVar61._12_4_ = auVar40._12_4_ * 0.99999964;
    uVar14 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar14;
    local_23c0._0_4_ = uVar14;
    local_23c0._8_4_ = uVar14;
    local_23c0._12_4_ = uVar14;
    local_23c0._16_4_ = uVar14;
    local_23c0._20_4_ = uVar14;
    local_23c0._24_4_ = uVar14;
    local_23c0._28_4_ = uVar14;
    auVar89 = ZEXT3264(local_23c0);
    uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar14;
    local_23e0._0_4_ = uVar14;
    local_23e0._8_4_ = uVar14;
    local_23e0._12_4_ = uVar14;
    local_23e0._16_4_ = uVar14;
    local_23e0._20_4_ = uVar14;
    local_23e0._24_4_ = uVar14;
    local_23e0._28_4_ = uVar14;
    auVar93 = ZEXT3264(local_23e0);
    auVar55._0_4_ = auVar40._0_4_ * 1.0000004;
    auVar55._4_4_ = auVar40._4_4_ * 1.0000004;
    auVar55._8_4_ = auVar40._8_4_ * 1.0000004;
    auVar55._12_4_ = auVar40._12_4_ * 1.0000004;
    uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar14;
    local_2400._0_4_ = uVar14;
    local_2400._8_4_ = uVar14;
    local_2400._12_4_ = uVar14;
    local_2400._16_4_ = uVar14;
    local_2400._20_4_ = uVar14;
    local_2400._24_4_ = uVar14;
    local_2400._28_4_ = uVar14;
    auVar94 = ZEXT3264(local_2400);
    auVar40 = vmovshdup_avx(auVar61);
    uVar54 = auVar40._0_8_;
    local_2440._8_8_ = uVar54;
    local_2440._0_8_ = uVar54;
    local_2440._16_8_ = uVar54;
    local_2440._24_8_ = uVar54;
    auVar102 = ZEXT3264(local_2440);
    auVar69 = vshufpd_avx(auVar61,auVar61,1);
    auVar81 = vshufps_avx(auVar61,auVar61,0xaa);
    uVar54 = auVar81._0_8_;
    local_2460._8_8_ = uVar54;
    local_2460._0_8_ = uVar54;
    local_2460._16_8_ = uVar54;
    local_2460._24_8_ = uVar54;
    auVar104 = ZEXT3264(local_2460);
    uVar18 = (ulong)(auVar61._0_4_ < 0.0) << 5;
    auVar81 = vmovshdup_avx(auVar55);
    uVar54 = auVar81._0_8_;
    local_24a0._8_8_ = uVar54;
    local_24a0._0_8_ = uVar54;
    local_24a0._16_8_ = uVar54;
    local_24a0._24_8_ = uVar54;
    auVar107 = ZEXT3264(local_24a0);
    auVar81 = vshufps_avx(auVar55,auVar55,0xaa);
    uVar54 = auVar81._0_8_;
    local_24c0._8_8_ = uVar54;
    local_24c0._0_8_ = uVar54;
    local_24c0._16_8_ = uVar54;
    local_24c0._24_8_ = uVar54;
    auVar109 = ZEXT3264(local_24c0);
    uVar29 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x40;
    uVar31 = (ulong)(auVar69._0_4_ < 0.0) << 5 | 0x80;
    local_2698 = uVar18 ^ 0x20;
    uVar14 = auVar47._0_4_;
    local_2580._4_4_ = uVar14;
    local_2580._0_4_ = uVar14;
    local_2580._8_4_ = uVar14;
    local_2580._12_4_ = uVar14;
    local_2580._16_4_ = uVar14;
    local_2580._20_4_ = uVar14;
    local_2580._24_4_ = uVar14;
    local_2580._28_4_ = uVar14;
    auVar83 = ZEXT3264(local_2580);
    uVar14 = auVar82._0_4_;
    auVar39 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,CONCAT412
                                                  (uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))))
                                                  ))));
    local_2660 = mm_lookupmask_ps._240_8_;
    uStack_2658 = mm_lookupmask_ps._248_8_;
    local_26f8 = context;
    local_2420 = auVar61._0_4_;
    fStack_241c = auVar61._0_4_;
    fStack_2418 = auVar61._0_4_;
    fStack_2414 = auVar61._0_4_;
    fStack_2410 = auVar61._0_4_;
    fStack_240c = auVar61._0_4_;
    fStack_2408 = auVar61._0_4_;
    fStack_2404 = auVar61._0_4_;
    local_2480 = auVar55._0_4_;
    fStack_247c = auVar55._0_4_;
    fStack_2478 = auVar55._0_4_;
    fStack_2474 = auVar55._0_4_;
    fStack_2470 = auVar55._0_4_;
    fStack_246c = auVar55._0_4_;
    fStack_2468 = auVar55._0_4_;
    fStack_2464 = auVar55._0_4_;
    local_2788 = ray;
    local_2790 = uVar18;
    fVar108 = auVar55._0_4_;
    fVar92 = auVar55._0_4_;
    fVar91 = auVar55._0_4_;
    fVar90 = auVar55._0_4_;
    fVar84 = auVar55._0_4_;
    fVar105 = auVar55._0_4_;
    fVar101 = auVar61._0_4_;
    fVar100 = auVar61._0_4_;
    fVar99 = auVar61._0_4_;
    fVar98 = auVar61._0_4_;
    fVar97 = auVar61._0_4_;
    fVar95 = auVar61._0_4_;
LAB_0199cb04:
    do {
      pauVar30 = pauVar15 + -1;
      pauVar15 = pauVar15 + -1;
      if (*(float *)(*pauVar30 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar21 = *(ulong *)*pauVar15;
        while ((uVar21 & 8) == 0) {
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar18),auVar89._0_32_);
          auVar6._4_4_ = fVar97 * auVar5._4_4_;
          auVar6._0_4_ = fVar95 * auVar5._0_4_;
          auVar6._8_4_ = fVar98 * auVar5._8_4_;
          auVar6._12_4_ = fVar99 * auVar5._12_4_;
          auVar6._16_4_ = fVar100 * auVar5._16_4_;
          auVar6._20_4_ = fVar101 * auVar5._20_4_;
          auVar6._24_4_ = auVar61._0_4_ * auVar5._24_4_;
          auVar6._28_4_ = auVar5._28_4_;
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar29),auVar93._0_32_);
          auVar8._4_4_ = auVar102._4_4_ * auVar5._4_4_;
          auVar8._0_4_ = auVar102._0_4_ * auVar5._0_4_;
          auVar8._8_4_ = auVar102._8_4_ * auVar5._8_4_;
          auVar8._12_4_ = auVar102._12_4_ * auVar5._12_4_;
          auVar8._16_4_ = auVar102._16_4_ * auVar5._16_4_;
          auVar8._20_4_ = auVar102._20_4_ * auVar5._20_4_;
          auVar8._24_4_ = auVar102._24_4_ * auVar5._24_4_;
          auVar8._28_4_ = auVar5._28_4_;
          auVar5 = vmaxps_avx(auVar6,auVar8);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar31),auVar94._0_32_);
          auVar9._4_4_ = auVar104._4_4_ * auVar6._4_4_;
          auVar9._0_4_ = auVar104._0_4_ * auVar6._0_4_;
          auVar9._8_4_ = auVar104._8_4_ * auVar6._8_4_;
          auVar9._12_4_ = auVar104._12_4_ * auVar6._12_4_;
          auVar9._16_4_ = auVar104._16_4_ * auVar6._16_4_;
          auVar9._20_4_ = auVar104._20_4_ * auVar6._20_4_;
          auVar9._24_4_ = auVar104._24_4_ * auVar6._24_4_;
          auVar9._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar9,auVar83._0_32_);
          local_2640 = vmaxps_avx(auVar5,auVar6);
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + local_2698),auVar89._0_32_);
          auVar10._4_4_ = fVar84 * auVar5._4_4_;
          auVar10._0_4_ = fVar105 * auVar5._0_4_;
          auVar10._8_4_ = fVar90 * auVar5._8_4_;
          auVar10._12_4_ = fVar91 * auVar5._12_4_;
          auVar10._16_4_ = fVar92 * auVar5._16_4_;
          auVar10._20_4_ = fVar108 * auVar5._20_4_;
          auVar10._24_4_ = auVar55._0_4_ * auVar5._24_4_;
          auVar10._28_4_ = auVar5._28_4_;
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + (uVar29 ^ 0x20)),auVar93._0_32_
                             );
          auVar11._4_4_ = auVar107._4_4_ * auVar5._4_4_;
          auVar11._0_4_ = auVar107._0_4_ * auVar5._0_4_;
          auVar11._8_4_ = auVar107._8_4_ * auVar5._8_4_;
          auVar11._12_4_ = auVar107._12_4_ * auVar5._12_4_;
          auVar11._16_4_ = auVar107._16_4_ * auVar5._16_4_;
          auVar11._20_4_ = auVar107._20_4_ * auVar5._20_4_;
          auVar11._24_4_ = auVar107._24_4_ * auVar5._24_4_;
          auVar11._28_4_ = auVar5._28_4_;
          auVar5 = vminps_avx(auVar10,auVar11);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + (uVar31 ^ 0x20)),auVar94._0_32_
                             );
          auVar12._4_4_ = auVar109._4_4_ * auVar6._4_4_;
          auVar12._0_4_ = auVar109._0_4_ * auVar6._0_4_;
          auVar12._8_4_ = auVar109._8_4_ * auVar6._8_4_;
          auVar12._12_4_ = auVar109._12_4_ * auVar6._12_4_;
          auVar12._16_4_ = auVar109._16_4_ * auVar6._16_4_;
          auVar12._20_4_ = auVar109._20_4_ * auVar6._20_4_;
          auVar12._24_4_ = auVar109._24_4_ * auVar6._24_4_;
          auVar12._28_4_ = auVar6._28_4_;
          auVar6 = vminps_avx(auVar12,auVar39._0_32_);
          auVar5 = vminps_avx(auVar5,auVar6);
          auVar5 = vcmpps_avx(local_2640,auVar5,2);
          uVar24 = vmovmskps_avx(auVar5);
          if (uVar24 == 0) {
            if (pauVar15 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_0199cb04;
          }
          uVar24 = uVar24 & 0xff;
          uVar17 = uVar21 & 0xfffffffffffffff0;
          lVar28 = 0;
          for (uVar21 = (ulong)uVar24; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000)
          {
            lVar28 = lVar28 + 1;
          }
          uVar21 = *(ulong *)(uVar17 + lVar28 * 8);
          uVar24 = uVar24 - 1 & uVar24;
          uVar27 = (ulong)uVar24;
          if (uVar24 != 0) {
            uVar3 = *(uint *)(local_2640 + lVar28 * 4);
            lVar28 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
            uVar24 = uVar24 - 1 & uVar24;
            uVar25 = (ulong)uVar24;
            uVar27 = *(ulong *)(uVar17 + lVar28 * 8);
            uVar2 = *(uint *)(local_2640 + lVar28 * 4);
            if (uVar24 == 0) {
              if (uVar3 < uVar2) {
                *(ulong *)*pauVar15 = uVar27;
                *(uint *)(*pauVar15 + 8) = uVar2;
                pauVar15 = pauVar15 + 1;
              }
              else {
                *(ulong *)*pauVar15 = uVar21;
                *(uint *)(*pauVar15 + 8) = uVar3;
                pauVar15 = pauVar15 + 1;
                uVar21 = uVar27;
              }
            }
            else {
              auVar40._8_8_ = 0;
              auVar40._0_8_ = uVar21;
              auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar3));
              auVar47._8_8_ = 0;
              auVar47._0_8_ = uVar27;
              auVar81 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar2));
              lVar28 = 0;
              for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                lVar28 = lVar28 + 1;
              }
              uVar24 = uVar24 - 1 & uVar24;
              uVar21 = (ulong)uVar24;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = *(ulong *)(uVar17 + lVar28 * 8);
              auVar47 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_2640 + lVar28 * 4)));
              if (uVar24 == 0) {
                auVar82 = vpcmpgtd_avx(auVar81,auVar40);
                auVar69 = vpshufd_avx(auVar82,0xaa);
                auVar82 = vblendvps_avx(auVar81,auVar40,auVar69);
                auVar40 = vblendvps_avx(auVar40,auVar81,auVar69);
                auVar81 = vpcmpgtd_avx(auVar47,auVar82);
                auVar69 = vpshufd_avx(auVar81,0xaa);
                auVar81 = vblendvps_avx(auVar47,auVar82,auVar69);
                auVar47 = vblendvps_avx(auVar82,auVar47,auVar69);
                auVar82 = vpcmpgtd_avx(auVar47,auVar40);
                auVar69 = vpshufd_avx(auVar82,0xaa);
                auVar82 = vblendvps_avx(auVar47,auVar40,auVar69);
                auVar40 = vblendvps_avx(auVar40,auVar47,auVar69);
                *pauVar15 = auVar40;
                pauVar15[1] = auVar82;
                uVar21 = auVar81._0_8_;
                pauVar15 = pauVar15 + 2;
              }
              else {
                lVar28 = 0;
                for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  lVar28 = lVar28 + 1;
                }
                uVar24 = uVar24 - 1 & uVar24;
                uVar18 = (ulong)uVar24;
                auVar62._8_8_ = 0;
                auVar62._0_8_ = *(ulong *)(uVar17 + lVar28 * 8);
                auVar82 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_2640 + lVar28 * 4)));
                if (uVar24 == 0) {
                  auVar69 = vpcmpgtd_avx(auVar81,auVar40);
                  auVar70 = vpshufd_avx(auVar69,0xaa);
                  auVar69 = vblendvps_avx(auVar81,auVar40,auVar70);
                  auVar40 = vblendvps_avx(auVar40,auVar81,auVar70);
                  auVar81 = vpcmpgtd_avx(auVar82,auVar47);
                  auVar70 = vpshufd_avx(auVar81,0xaa);
                  auVar81 = vblendvps_avx(auVar82,auVar47,auVar70);
                  auVar47 = vblendvps_avx(auVar47,auVar82,auVar70);
                  auVar82 = vpcmpgtd_avx(auVar47,auVar40);
                  auVar70 = vpshufd_avx(auVar82,0xaa);
                  auVar82 = vblendvps_avx(auVar47,auVar40,auVar70);
                  auVar40 = vblendvps_avx(auVar40,auVar47,auVar70);
                  auVar47 = vpcmpgtd_avx(auVar81,auVar69);
                  auVar70 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar81,auVar69,auVar70);
                  auVar81 = vblendvps_avx(auVar69,auVar81,auVar70);
                  auVar69 = vpcmpgtd_avx(auVar82,auVar81);
                  auVar70 = vpshufd_avx(auVar69,0xaa);
                  auVar69 = vblendvps_avx(auVar82,auVar81,auVar70);
                  auVar81 = vblendvps_avx(auVar81,auVar82,auVar70);
                  *pauVar15 = auVar40;
                  pauVar15[1] = auVar81;
                  pauVar15[2] = auVar69;
                  uVar21 = auVar47._0_8_;
                  pauVar30 = pauVar15 + 3;
                }
                else {
                  *pauVar15 = auVar40;
                  pauVar15[1] = auVar81;
                  pauVar15[2] = auVar47;
                  pauVar15[3] = auVar82;
                  lVar28 = 0x30;
                  do {
                    lVar22 = lVar28;
                    lVar28 = 0;
                    for (uVar21 = uVar18; (uVar21 & 1) == 0;
                        uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                      lVar28 = lVar28 + 1;
                    }
                    uVar21 = *(ulong *)(uVar17 + lVar28 * 8);
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = uVar21;
                    auVar40 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_2640 + lVar28 * 4)));
                    *(undefined1 (*) [16])(pauVar15[1] + lVar22) = auVar40;
                    uVar18 = uVar18 - 1 & uVar18;
                    lVar28 = lVar22 + 0x10;
                  } while (uVar18 != 0);
                  pauVar30 = (undefined1 (*) [16])(pauVar15[1] + lVar22);
                  if (lVar22 + 0x10 != 0) {
                    lVar28 = 0x10;
                    pauVar19 = pauVar15;
                    do {
                      auVar40 = pauVar19[1];
                      pauVar19 = pauVar19 + 1;
                      uVar24 = vextractps_avx(auVar40,2);
                      lVar22 = lVar28;
                      do {
                        if (uVar24 <= *(uint *)(pauVar15[-1] + lVar22 + 8)) {
                          pauVar23 = (undefined1 (*) [16])(*pauVar15 + lVar22);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar15 + lVar22) =
                             *(undefined1 (*) [16])(pauVar15[-1] + lVar22);
                        lVar22 = lVar22 + -0x10;
                        pauVar23 = pauVar15;
                      } while (lVar22 != 0);
                      *pauVar23 = auVar40;
                      lVar28 = lVar28 + 0x10;
                    } while (pauVar30 != pauVar19);
                    uVar21 = *(ulong *)*pauVar30;
                  }
                }
                auVar83 = ZEXT3264(local_2580);
                pauVar15 = pauVar30;
                ray = local_2788;
                uVar18 = local_2790;
              }
            }
          }
        }
        local_26a0 = (ulong)((uint)uVar21 & 0xf) - 8;
        if (local_26a0 != 0) {
          uVar21 = uVar21 & 0xfffffffffffffff0;
          local_2740 = 0;
          do {
            lVar28 = local_2740 * 0xb0;
            uVar14 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar32._4_4_ = uVar14;
            auVar32._0_4_ = uVar14;
            auVar32._8_4_ = uVar14;
            auVar32._12_4_ = uVar14;
            uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar48._4_4_ = uVar14;
            auVar48._0_4_ = uVar14;
            auVar48._8_4_ = uVar14;
            auVar48._12_4_ = uVar14;
            uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar56._4_4_ = uVar14;
            auVar56._0_4_ = uVar14;
            auVar56._8_4_ = uVar14;
            auVar56._12_4_ = uVar14;
            local_24d0 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + lVar28),auVar32);
            local_24e0 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x10 + lVar28),auVar48);
            local_2720 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + lVar28),auVar56);
            auVar40 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x30 + lVar28),auVar32);
            auVar81 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x40 + lVar28),auVar48);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x50 + lVar28),auVar56);
            auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x60 + lVar28),auVar32);
            auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x70 + lVar28),auVar48);
            auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x80 + lVar28),auVar56);
            local_26f0 = vsubps_avx(auVar82,local_24d0);
            local_26b0 = vsubps_avx(auVar69,local_24e0);
            local_2730 = vsubps_avx(auVar70,local_2720);
            auVar33._0_4_ = local_24d0._0_4_ + auVar82._0_4_;
            auVar33._4_4_ = local_24d0._4_4_ + auVar82._4_4_;
            auVar33._8_4_ = local_24d0._8_4_ + auVar82._8_4_;
            auVar33._12_4_ = local_24d0._12_4_ + auVar82._12_4_;
            auVar57._0_4_ = local_24e0._0_4_ + auVar69._0_4_;
            auVar57._4_4_ = local_24e0._4_4_ + auVar69._4_4_;
            auVar57._8_4_ = local_24e0._8_4_ + auVar69._8_4_;
            auVar57._12_4_ = local_24e0._12_4_ + auVar69._12_4_;
            fVar84 = local_2720._0_4_;
            auVar63._0_4_ = fVar84 + auVar70._0_4_;
            fVar90 = local_2720._4_4_;
            auVar63._4_4_ = fVar90 + auVar70._4_4_;
            fVar91 = local_2720._8_4_;
            auVar63._8_4_ = fVar91 + auVar70._8_4_;
            fVar92 = local_2720._12_4_;
            auVar63._12_4_ = fVar92 + auVar70._12_4_;
            auVar106._0_4_ = local_2730._0_4_ * auVar57._0_4_;
            auVar106._4_4_ = local_2730._4_4_ * auVar57._4_4_;
            auVar106._8_4_ = local_2730._8_4_ * auVar57._8_4_;
            auVar106._12_4_ = local_2730._12_4_ * auVar57._12_4_;
            auVar61 = vfmsub231ps_fma(auVar106,local_26b0,auVar63);
            auVar64._0_4_ = auVar63._0_4_ * local_26f0._0_4_;
            auVar64._4_4_ = auVar63._4_4_ * local_26f0._4_4_;
            auVar64._8_4_ = auVar63._8_4_ * local_26f0._8_4_;
            auVar64._12_4_ = auVar63._12_4_ * local_26f0._12_4_;
            auVar55 = vfmsub231ps_fma(auVar64,local_2730,auVar33);
            auVar34._0_4_ = local_26b0._0_4_ * auVar33._0_4_;
            auVar34._4_4_ = local_26b0._4_4_ * auVar33._4_4_;
            auVar34._8_4_ = local_26b0._8_4_ * auVar33._8_4_;
            auVar34._12_4_ = local_26b0._12_4_ * auVar33._12_4_;
            auVar62 = vfmsub231ps_fma(auVar34,local_26f0,auVar57);
            local_2770._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar103._0_4_ = local_2770._4_4_ * auVar62._0_4_;
            auVar103._4_4_ = local_2770._4_4_ * auVar62._4_4_;
            auVar103._8_4_ = local_2770._4_4_ * auVar62._8_4_;
            auVar103._12_4_ = local_2770._4_4_ * auVar62._12_4_;
            uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar35._4_4_ = uVar14;
            auVar35._0_4_ = uVar14;
            auVar35._8_4_ = uVar14;
            auVar35._12_4_ = uVar14;
            auVar55 = vfmadd231ps_fma(auVar103,auVar35,auVar55);
            uVar14 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            local_2780._4_4_ = uVar14;
            local_2780._0_4_ = uVar14;
            local_2780._8_4_ = uVar14;
            local_2780._12_4_ = uVar14;
            local_2760 = vfmadd231ps_fma(auVar55,local_2780,auVar61);
            local_2500 = vsubps_avx(local_24e0,auVar81);
            local_2510 = vsubps_avx(local_2720,auVar47);
            auVar58._0_4_ = local_24e0._0_4_ + auVar81._0_4_;
            auVar58._4_4_ = local_24e0._4_4_ + auVar81._4_4_;
            auVar58._8_4_ = local_24e0._8_4_ + auVar81._8_4_;
            auVar58._12_4_ = local_24e0._12_4_ + auVar81._12_4_;
            auVar65._0_4_ = auVar47._0_4_ + fVar84;
            auVar65._4_4_ = auVar47._4_4_ + fVar90;
            auVar65._8_4_ = auVar47._8_4_ + fVar91;
            auVar65._12_4_ = auVar47._12_4_ + fVar92;
            fVar95 = local_2510._0_4_;
            auVar74._0_4_ = auVar58._0_4_ * fVar95;
            fVar98 = local_2510._4_4_;
            auVar74._4_4_ = auVar58._4_4_ * fVar98;
            fVar100 = local_2510._8_4_;
            auVar74._8_4_ = auVar58._8_4_ * fVar100;
            auVar61._0_4_ = local_2510._12_4_;
            auVar74._12_4_ = auVar58._12_4_ * auVar61._0_4_;
            auVar41 = vfmsub231ps_fma(auVar74,local_2500,auVar65);
            local_24f0 = vsubps_avx(local_24d0,auVar40);
            fVar97 = local_24f0._0_4_;
            auVar85._0_4_ = auVar65._0_4_ * fVar97;
            fVar99 = local_24f0._4_4_;
            auVar85._4_4_ = auVar65._4_4_ * fVar99;
            fVar101 = local_24f0._8_4_;
            auVar85._8_4_ = auVar65._8_4_ * fVar101;
            fVar105 = local_24f0._12_4_;
            auVar85._12_4_ = auVar65._12_4_ * fVar105;
            auVar66._0_4_ = local_24d0._0_4_ + auVar40._0_4_;
            auVar66._4_4_ = local_24d0._4_4_ + auVar40._4_4_;
            auVar66._8_4_ = local_24d0._8_4_ + auVar40._8_4_;
            auVar66._12_4_ = local_24d0._12_4_ + auVar40._12_4_;
            auVar62 = vfmsub231ps_fma(auVar85,local_2510,auVar66);
            fVar108 = local_2500._0_4_;
            auVar67._0_4_ = fVar108 * auVar66._0_4_;
            auVar55._0_4_ = local_2500._4_4_;
            auVar67._4_4_ = auVar55._0_4_ * auVar66._4_4_;
            fVar110 = local_2500._8_4_;
            auVar67._8_4_ = fVar110 * auVar66._8_4_;
            fVar111 = local_2500._12_4_;
            auVar67._12_4_ = fVar111 * auVar66._12_4_;
            auVar7 = vfmsub231ps_fma(auVar67,local_24f0,auVar58);
            auVar68._0_4_ = local_2770._4_4_ * auVar7._0_4_;
            auVar68._4_4_ = local_2770._4_4_ * auVar7._4_4_;
            auVar68._8_4_ = local_2770._4_4_ * auVar7._8_4_;
            auVar68._12_4_ = local_2770._4_4_ * auVar7._12_4_;
            auVar62 = vfmadd231ps_fma(auVar68,auVar35,auVar62);
            local_2520 = vfmadd231ps_fma(auVar62,local_2780,auVar41);
            auVar62 = vsubps_avx(auVar40,auVar82);
            auVar75._0_4_ = auVar40._0_4_ + auVar82._0_4_;
            auVar75._4_4_ = auVar40._4_4_ + auVar82._4_4_;
            auVar75._8_4_ = auVar40._8_4_ + auVar82._8_4_;
            auVar75._12_4_ = auVar40._12_4_ + auVar82._12_4_;
            auVar82 = vsubps_avx(auVar81,auVar69);
            auVar49._0_4_ = auVar81._0_4_ + auVar69._0_4_;
            auVar49._4_4_ = auVar81._4_4_ + auVar69._4_4_;
            auVar49._8_4_ = auVar81._8_4_ + auVar69._8_4_;
            auVar49._12_4_ = auVar81._12_4_ + auVar69._12_4_;
            auVar69 = vsubps_avx(auVar47,auVar70);
            auVar42._0_4_ = auVar47._0_4_ + auVar70._0_4_;
            auVar42._4_4_ = auVar47._4_4_ + auVar70._4_4_;
            auVar42._8_4_ = auVar47._8_4_ + auVar70._8_4_;
            auVar42._12_4_ = auVar47._12_4_ + auVar70._12_4_;
            auVar71._0_4_ = auVar69._0_4_ * auVar49._0_4_;
            auVar71._4_4_ = auVar69._4_4_ * auVar49._4_4_;
            auVar71._8_4_ = auVar69._8_4_ * auVar49._8_4_;
            auVar71._12_4_ = auVar69._12_4_ * auVar49._12_4_;
            auVar81 = vfmsub231ps_fma(auVar71,auVar82,auVar42);
            auVar43._0_4_ = auVar42._0_4_ * auVar62._0_4_;
            auVar43._4_4_ = auVar42._4_4_ * auVar62._4_4_;
            auVar43._8_4_ = auVar42._8_4_ * auVar62._8_4_;
            auVar43._12_4_ = auVar42._12_4_ * auVar62._12_4_;
            auVar40 = vfmsub231ps_fma(auVar43,auVar69,auVar75);
            auVar76._0_4_ = auVar82._0_4_ * auVar75._0_4_;
            auVar76._4_4_ = auVar82._4_4_ * auVar75._4_4_;
            auVar76._8_4_ = auVar82._8_4_ * auVar75._8_4_;
            auVar76._12_4_ = auVar82._12_4_ * auVar75._12_4_;
            auVar47 = vfmsub231ps_fma(auVar76,auVar62,auVar49);
            local_2770._0_4_ = (uint)local_2770._4_4_;
            fStack_2768 = local_2770._4_4_;
            fStack_2764 = local_2770._4_4_;
            auVar50._0_4_ = local_2770._4_4_ * auVar47._0_4_;
            auVar50._4_4_ = local_2770._4_4_ * auVar47._4_4_;
            auVar50._8_4_ = local_2770._4_4_ * auVar47._8_4_;
            auVar50._12_4_ = local_2770._4_4_ * auVar47._12_4_;
            auVar40 = vfmadd231ps_fma(auVar50,auVar35,auVar40);
            auVar70 = vfmadd231ps_fma(auVar40,local_2780,auVar81);
            local_2540._0_4_ = auVar70._0_4_ + local_2760._0_4_ + local_2520._0_4_;
            local_2540._4_4_ = auVar70._4_4_ + local_2760._4_4_ + local_2520._4_4_;
            local_2540._8_4_ = auVar70._8_4_ + local_2760._8_4_ + local_2520._8_4_;
            local_2540._12_4_ = auVar70._12_4_ + local_2760._12_4_ + local_2520._12_4_;
            auVar40 = vminps_avx(local_2760,local_2520);
            auVar81 = vminps_avx(auVar40,auVar70);
            auVar40 = vandps_avx(local_2540,local_2650);
            auVar72._0_4_ = auVar40._0_4_ * 1.1920929e-07;
            auVar72._4_4_ = auVar40._4_4_ * 1.1920929e-07;
            auVar72._8_4_ = auVar40._8_4_ * 1.1920929e-07;
            auVar72._12_4_ = auVar40._12_4_ * 1.1920929e-07;
            uVar17 = CONCAT44(auVar72._4_4_,auVar72._0_4_);
            auVar77._0_8_ = uVar17 ^ 0x8000000080000000;
            auVar77._8_4_ = -auVar72._8_4_;
            auVar77._12_4_ = -auVar72._12_4_;
            auVar81 = vcmpps_avx(auVar81,auVar77,5);
            auVar47 = vmaxps_avx(local_2760,local_2520);
            auVar47 = vmaxps_avx(auVar47,auVar70);
            auVar47 = vcmpps_avx(auVar47,auVar72,2);
            local_2530 = vorps_avx(auVar81,auVar47);
            auVar7._8_8_ = uStack_2658;
            auVar7._0_8_ = local_2660;
            auVar7 = auVar7 & local_2530;
            if ((((auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar7[0xf] < '\0') {
              auVar44._0_4_ = fVar108 * local_2730._0_4_;
              auVar44._4_4_ = auVar55._0_4_ * local_2730._4_4_;
              auVar44._8_4_ = fVar110 * local_2730._8_4_;
              auVar44._12_4_ = fVar111 * local_2730._12_4_;
              local_2550 = 0x80000000;
              uStack_254c = 0x80000000;
              uStack_2548 = 0x80000000;
              uStack_2544 = 0x80000000;
              auVar73._0_4_ = fVar97 * local_26b0._0_4_;
              auVar73._4_4_ = fVar99 * local_26b0._4_4_;
              auVar73._8_4_ = fVar101 * local_26b0._8_4_;
              auVar73._12_4_ = fVar105 * local_26b0._12_4_;
              auVar70 = vfmsub213ps_fma(local_26b0,local_2510,auVar44);
              auVar51._0_4_ = fVar95 * auVar82._0_4_;
              auVar51._4_4_ = fVar98 * auVar82._4_4_;
              auVar51._8_4_ = fVar100 * auVar82._8_4_;
              auVar51._12_4_ = auVar61._0_4_ * auVar82._12_4_;
              auVar78._0_4_ = auVar69._0_4_ * fVar97;
              auVar78._4_4_ = auVar69._4_4_ * fVar99;
              auVar78._8_4_ = auVar69._8_4_ * fVar101;
              auVar78._12_4_ = auVar69._12_4_ * fVar105;
              auVar69 = vfmsub213ps_fma(auVar69,local_2500,auVar51);
              local_26b0 = auVar40;
              auVar81 = vandps_avx(local_2650,auVar44);
              auVar47 = vandps_avx(local_2650,auVar51);
              auVar81 = vcmpps_avx(auVar81,auVar47,1);
              local_25c0 = vblendvps_avx(auVar69,auVar70,auVar81);
              auVar86._0_4_ = fVar108 * auVar62._0_4_;
              auVar86._4_4_ = auVar55._0_4_ * auVar62._4_4_;
              auVar86._8_4_ = fVar110 * auVar62._8_4_;
              auVar86._12_4_ = fVar111 * auVar62._12_4_;
              auVar69 = vfmsub213ps_fma(auVar62,local_2510,auVar78);
              auVar52._0_4_ = fVar95 * local_26f0._0_4_;
              auVar52._4_4_ = fVar98 * local_26f0._4_4_;
              auVar52._8_4_ = fVar100 * local_26f0._8_4_;
              auVar52._12_4_ = auVar61._0_4_ * local_26f0._12_4_;
              auVar55 = vfmsub213ps_fma(local_2730,local_24f0,auVar52);
              auVar81 = vandps_avx(local_2650,auVar52);
              auVar47 = vandps_avx(local_2650,auVar78);
              auVar81 = vcmpps_avx(auVar81,auVar47,1);
              local_25b0 = vblendvps_avx(auVar69,auVar55,auVar81);
              auVar69 = vfmsub213ps_fma(local_26f0,local_2500,auVar73);
              auVar82 = vfmsub213ps_fma(auVar82,local_24f0,auVar86);
              auVar81 = vandps_avx(local_2650,auVar73);
              auVar47 = vandps_avx(local_2650,auVar86);
              auVar81 = vcmpps_avx(auVar81,auVar47,1);
              local_25a0[0] = vblendvps_avx(auVar82,auVar69,auVar81);
              auVar59._0_4_ = local_25a0[0]._0_4_ * local_2770._4_4_;
              auVar59._4_4_ = local_25a0[0]._4_4_ * local_2770._4_4_;
              auVar59._8_4_ = local_25a0[0]._8_4_ * local_2770._4_4_;
              auVar59._12_4_ = local_25a0[0]._12_4_ * local_2770._4_4_;
              auVar81 = vfmadd213ps_fma(auVar35,local_25b0,auVar59);
              auVar81 = vfmadd213ps_fma(local_2780,local_25c0,auVar81);
              auVar60._0_4_ = auVar81._0_4_ + auVar81._0_4_;
              auVar60._4_4_ = auVar81._4_4_ + auVar81._4_4_;
              auVar60._8_4_ = auVar81._8_4_ + auVar81._8_4_;
              auVar60._12_4_ = auVar81._12_4_ + auVar81._12_4_;
              auVar79._0_4_ = local_25a0[0]._0_4_ * fVar84;
              auVar79._4_4_ = local_25a0[0]._4_4_ * fVar90;
              auVar79._8_4_ = local_25a0[0]._8_4_ * fVar91;
              auVar79._12_4_ = local_25a0[0]._12_4_ * fVar92;
              auVar81 = vfmadd213ps_fma(local_24e0,local_25b0,auVar79);
              auVar47 = vfmadd213ps_fma(local_24d0,local_25c0,auVar81);
              auVar81 = vrcpps_avx(auVar60);
              auVar96._8_4_ = 0x3f800000;
              auVar96._0_8_ = 0x3f8000003f800000;
              auVar96._12_4_ = 0x3f800000;
              auVar82 = vfnmadd213ps_fma(auVar81,auVar60,auVar96);
              auVar81 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
              local_2750._0_4_ = auVar81._0_4_ * (auVar47._0_4_ + auVar47._0_4_);
              local_2750._4_4_ = auVar81._4_4_ * (auVar47._4_4_ + auVar47._4_4_);
              local_2750._8_4_ = auVar81._8_4_ * (auVar47._8_4_ + auVar47._8_4_);
              local_2750._12_4_ = auVar81._12_4_ * (auVar47._12_4_ + auVar47._12_4_);
              uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar80._4_4_ = uVar14;
              auVar80._0_4_ = uVar14;
              auVar80._8_4_ = uVar14;
              auVar80._12_4_ = uVar14;
              auVar81 = vcmpps_avx(auVar80,local_2750,2);
              fVar95 = (ray->super_RayK<1>).tfar;
              auVar87._4_4_ = fVar95;
              auVar87._0_4_ = fVar95;
              auVar87._8_4_ = fVar95;
              auVar87._12_4_ = fVar95;
              auVar47 = vcmpps_avx(local_2750,auVar87,2);
              auVar81 = vandps_avx(auVar47,auVar81);
              uVar17 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
              auVar88._0_8_ = uVar17 ^ 0x8000000080000000;
              auVar88._8_4_ = -auVar60._8_4_;
              auVar88._12_4_ = -auVar60._12_4_;
              auVar47 = vcmpps_avx(auVar60,auVar88,4);
              auVar81 = vandps_avx(auVar47,auVar81);
              auVar13._8_8_ = uStack_2658;
              auVar13._0_8_ = local_2660;
              auVar47 = vandps_avx(local_2530,auVar13);
              auVar81 = vpslld_avx(auVar81,0x1f);
              auVar82 = vpsrad_avx(auVar81,0x1f);
              auVar81 = auVar47 & auVar82;
              if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar81[0xf] < '\0') {
                local_2720._0_4_ = (ray->super_RayK<1>).tfar;
                local_2720._4_4_ = (ray->super_RayK<1>).mask;
                local_2720._8_4_ = (ray->super_RayK<1>).id;
                local_2720._12_4_ = (ray->super_RayK<1>).flags;
                auVar81 = vandps_avx(auVar82,auVar47);
                local_2640._16_16_ = local_2520;
                local_2640._0_16_ = local_2760;
                local_2620 = local_2540;
                local_2610 = &local_2791;
                local_2600 = auVar81;
                local_25d0 = local_2750;
                pSVar26 = local_26f8->scene;
                local_2710 = auVar81;
                auVar47 = vrcpps_avx(local_2540);
                auVar53._8_4_ = 0x3f800000;
                auVar53._0_8_ = 0x3f8000003f800000;
                auVar53._12_4_ = 0x3f800000;
                auVar82 = vfnmadd213ps_fma(local_2540,auVar47,auVar53);
                auVar47 = vfmadd132ps_fma(auVar82,auVar47,auVar47);
                auVar45._8_4_ = 0x219392ef;
                auVar45._0_8_ = 0x219392ef219392ef;
                auVar45._12_4_ = 0x219392ef;
                auVar40 = vcmpps_avx(auVar40,auVar45,5);
                auVar40 = vandps_avx(auVar47,auVar40);
                auVar36._0_4_ = local_2760._0_4_ * auVar40._0_4_;
                auVar36._4_4_ = local_2760._4_4_ * auVar40._4_4_;
                auVar36._8_4_ = local_2760._8_4_ * auVar40._8_4_;
                auVar36._12_4_ = local_2760._12_4_ * auVar40._12_4_;
                local_25f0 = vminps_avx(auVar36,auVar53);
                auVar37._0_4_ = auVar40._0_4_ * local_2520._0_4_;
                auVar37._4_4_ = auVar40._4_4_ * local_2520._4_4_;
                auVar37._8_4_ = auVar40._8_4_ * local_2520._8_4_;
                auVar37._12_4_ = auVar40._12_4_ * local_2520._12_4_;
                local_25e0 = vminps_avx(auVar37,auVar53);
                auVar38._8_4_ = 0x7f800000;
                auVar38._0_8_ = 0x7f8000007f800000;
                auVar38._12_4_ = 0x7f800000;
                auVar40 = vblendvps_avx(auVar38,local_2750,auVar81);
                auVar47 = vshufps_avx(auVar40,auVar40,0xb1);
                auVar47 = vminps_avx(auVar47,auVar40);
                auVar82 = vshufpd_avx(auVar47,auVar47,1);
                auVar47 = vminps_avx(auVar82,auVar47);
                auVar40 = vcmpps_avx(auVar40,auVar47,0);
                auVar47 = auVar81 & auVar40;
                if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar47[0xf] < '\0') {
                  auVar81 = vandps_avx(auVar40,auVar81);
                }
                lVar28 = lVar28 + uVar21;
                uVar24 = vextractps_avx(local_2720,1);
                uVar14 = vmovmskps_avx(auVar81);
                piVar16 = (int *)0x0;
                for (uVar17 = CONCAT44((int)((ulong)local_26f8 >> 0x20),uVar14); (uVar17 & 1) == 0;
                    uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                  piVar16 = (int *)((long)piVar16 + 1);
                }
                do {
                  uVar3 = *(uint *)(lVar28 + 0x90 + (long)piVar16 * 4);
                  pGVar4 = (pSVar26->geometries).items[uVar3].ptr;
                  if ((pGVar4->mask & uVar24) == 0) {
                    *(undefined4 *)(local_2710 + (long)piVar16 * 4) = 0;
                  }
                  else {
                    local_2770 = (long)piVar16;
                    local_26f0._0_8_ = local_26f8->args;
                    if (local_26f8->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar20 = local_26f8->user;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar95 = *(float *)(local_25f0 + (long)piVar16 * 4);
                        fVar97 = *(float *)(local_25e0 + (long)piVar16 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_25d0 + (long)piVar16 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_25c0 + (long)piVar16 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_25b0 + (long)piVar16 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_25a0[0] + (long)piVar16 * 4);
                        ray->u = fVar95;
                        ray->v = fVar97;
                        ray->primID = *(uint *)(lVar28 + 0xa0 + (long)piVar16 * 4);
                        ray->geomID = uVar3;
                        ray->instID[0] = pRVar20->instID[0];
                        ray->instPrimID[0] = pRVar20->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar20 = local_26f8->user;
                    }
                    local_2780._0_8_ = pSVar26;
                    local_2690 = *(undefined4 *)(local_25c0 + (long)piVar16 * 4);
                    local_268c = *(undefined4 *)(local_25b0 + (long)piVar16 * 4);
                    local_2688 = *(undefined4 *)(local_25a0[0] + (long)piVar16 * 4);
                    local_2684 = *(undefined4 *)(local_25f0 + (long)piVar16 * 4);
                    local_2680 = *(undefined4 *)(local_25e0 + (long)piVar16 * 4);
                    local_267c = *(undefined4 *)(lVar28 + 0xa0 + (long)piVar16 * 4);
                    local_2678 = uVar3;
                    local_2674 = pRVar20->instID[0];
                    local_2670 = pRVar20->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_25d0 + (long)piVar16 * 4);
                    local_2734 = -1;
                    local_26e0.valid = &local_2734;
                    local_26e0.geometryUserPtr = pGVar4->userPtr;
                    local_26e0.context = pRVar20;
                    local_26e0.ray = (RTCRayN *)ray;
                    local_26e0.hit = (RTCHitN *)&local_2690;
                    local_26e0.N = 1;
                    local_2730._0_8_ = pGVar4;
                    local_2760._0_8_ = lVar28;
                    if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar4->intersectionFilterN)(&local_26e0), ray = local_2788,
                       uVar18 = local_2790, *local_26e0.valid != 0)) {
                      if ((*(code **)(local_26f0._0_8_ + 0x10) != (code *)0x0) &&
                         ((((*(byte *)local_26f0._0_8_ & 2) != 0 ||
                           ((*(byte *)(local_2730._0_8_ + 0x3e) & 0x40) != 0)) &&
                          ((**(code **)(local_26f0._0_8_ + 0x10))(&local_26e0), ray = local_2788,
                          uVar18 = local_2790, *local_26e0.valid == 0)))) goto LAB_0199d6c1;
                      (((Vec3f *)((long)local_26e0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_26e0.hit;
                      (((Vec3f *)((long)local_26e0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_26e0.hit + 4);
                      (((Vec3f *)((long)local_26e0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_26e0.hit + 8);
                      *(float *)((long)local_26e0.ray + 0x3c) = *(float *)(local_26e0.hit + 0xc);
                      *(float *)((long)local_26e0.ray + 0x40) = *(float *)(local_26e0.hit + 0x10);
                      *(float *)((long)local_26e0.ray + 0x44) = *(float *)(local_26e0.hit + 0x14);
                      *(float *)((long)local_26e0.ray + 0x48) = *(float *)(local_26e0.hit + 0x18);
                      *(float *)((long)local_26e0.ray + 0x4c) = *(float *)(local_26e0.hit + 0x1c);
                      *(float *)((long)local_26e0.ray + 0x50) = *(float *)(local_26e0.hit + 0x20);
                    }
                    else {
LAB_0199d6c1:
                      (local_2788->super_RayK<1>).tfar = (float)local_2720._0_4_;
                      ray = local_2788;
                      uVar18 = local_2790;
                    }
                    *(undefined4 *)(local_2710 + local_2770 * 4) = 0;
                    fVar95 = (ray->super_RayK<1>).tfar;
                    auVar46._4_4_ = fVar95;
                    auVar46._0_4_ = fVar95;
                    auVar46._8_4_ = fVar95;
                    auVar46._12_4_ = fVar95;
                    auVar40 = vcmpps_avx(local_2750,auVar46,2);
                    local_2710 = vandps_avx(auVar40,local_2710);
                    local_2720._0_4_ = (ray->super_RayK<1>).tfar;
                    local_2720._4_4_ = (ray->super_RayK<1>).mask;
                    local_2720._8_4_ = (ray->super_RayK<1>).id;
                    local_2720._12_4_ = (ray->super_RayK<1>).flags;
                    uVar24 = vextractps_avx(local_2720,1);
                    pSVar26 = (Scene *)local_2780._0_8_;
                    lVar28 = local_2760._0_8_;
                  }
                  if ((((local_2710 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2710 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2710 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2710[0xf]) break;
                  local_2780._0_8_ = pSVar26;
                  local_2760._0_8_ = lVar28;
                  local_2770._0_4_ = uVar24;
                  BVHNIntersector1<8,1,true,embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Pluecker<4,true>>>
                  ::intersect(&local_26e0);
                  piVar16 = local_26e0.valid;
                  ray = local_2788;
                  pSVar26 = (Scene *)local_2780._0_8_;
                  lVar28 = local_2760._0_8_;
                  uVar18 = local_2790;
                  uVar24 = (uint)local_2770;
                } while( true );
              }
            }
            local_2740 = local_2740 + 1;
          } while (local_2740 != local_26a0);
        }
        fVar95 = (ray->super_RayK<1>).tfar;
        auVar39 = ZEXT3264(CONCAT428(fVar95,CONCAT424(fVar95,CONCAT420(fVar95,CONCAT416(fVar95,
                                                  CONCAT412(fVar95,CONCAT48(fVar95,CONCAT44(fVar95,
                                                  fVar95))))))));
        auVar89 = ZEXT3264(local_23c0);
        auVar93 = ZEXT3264(local_23e0);
        auVar94 = ZEXT3264(local_2400);
        auVar102 = ZEXT3264(local_2440);
        auVar104 = ZEXT3264(local_2460);
        auVar107 = ZEXT3264(local_24a0);
        auVar109 = ZEXT3264(local_24c0);
        auVar83 = ZEXT3264(local_2580);
        fVar95 = local_2420;
        fVar97 = fStack_241c;
        fVar98 = fStack_2418;
        fVar99 = fStack_2414;
        fVar100 = fStack_2410;
        fVar101 = fStack_240c;
        auVar61._0_4_ = fStack_2408;
        fVar105 = local_2480;
        fVar84 = fStack_247c;
        fVar90 = fStack_2478;
        fVar91 = fStack_2474;
        fVar92 = fStack_2470;
        fVar108 = fStack_246c;
        auVar55._0_4_ = fStack_2468;
      }
    } while (pauVar15 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }